

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicOperationsBaseVS::Run(BasicOperationsBaseVS *this)

{
  pointer *ppuVar1;
  allocator<unsigned_char> *this_00;
  value_type vVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  GLuint GVar6;
  undefined4 extraout_var;
  size_type sVar7;
  reference pvVar8;
  byte *pbVar9;
  ulong local_f8;
  size_t i;
  undefined1 local_e8 [6];
  bool status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  undefined1 local_c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zero;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  char *local_50;
  char *glsl_vs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data;
  BasicOperationsBaseVS *this_local;
  
  bVar4 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  if (bVar4) {
    ppuVar1 = &expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
    iVar5 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])
                      (this,ppuVar1,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
    local_50 = (char *)CONCAT44(extraout_var,iVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,(char *)CONCAT44(extraout_var,iVar5),&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"",
               (allocator<char> *)
               ((long)&zero.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    GVar6 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_80,&local_a8);
    this->m_program = GVar6;
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&zero.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar4 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar4) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,2,this->m_buffer);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
      this_00 = (allocator<unsigned_char> *)
                ((long)&out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<unsigned_char>::allocator(this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,sVar7,this_00);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&out_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_buffer[1]);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,sVar7,pvVar8,0x88e4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_buffer[0]);
      ppuVar1 = &expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,sVar7,pvVar8,0x88e4);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c89);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,sVar7,
                 (allocator<unsigned_char> *)((long)&i + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 7));
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_buffer[1]);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,0);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,sVar7,pvVar8);
      i._6_1_ = 1;
      local_f8 = 0;
      while( true ) {
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
        if (sVar7 <= local_f8) break;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs,
                            local_f8);
        vVar2 = *pvVar8;
        pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                            local_f8);
        if (vVar2 != *pvVar8) {
          pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                              local_f8);
          bVar3 = *pbVar9;
          pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs,
                              local_f8);
          anon_unknown_0::Output
                    ("Byte at index %3d is %2x should be %2x.\n",local_f8 & 0xffffffff,(ulong)bVar3,
                     (ulong)*pbVar9);
          i._6_1_ = 0;
        }
        local_f8 = local_f8 + 1;
      }
      if ((i._6_1_ & 1) == 0) {
        this_local = (BasicOperationsBaseVS *)&DAT_ffffffffffffffff;
      }
      else {
        this_local = (BasicOperationsBaseVS *)0x0;
      }
      zero.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
    }
    else {
      this_local = (BasicOperationsBaseVS *)&DAT_ffffffffffffffff;
      zero.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&glsl_vs);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local = (BasicOperationsBaseVS *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;
		std::vector<GLubyte> in_data;
		std::vector<GLubyte> expected_data;
		const char*			 glsl_vs = GetInput(in_data, expected_data);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_buffer);

		/* output buffer */
		{
			std::vector<GLubyte> zero(expected_data.size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)expected_data.size(), &zero[0], GL_STATIC_DRAW);
		}
		// input buffer
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data.size(), &in_data[0], GL_STATIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		std::vector<GLubyte> out_data(expected_data.size());
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[1]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)out_data.size(), &out_data[0]);

		bool status = true;
		for (size_t i = 0; i < out_data.size(); ++i)
		{
			if (expected_data[i] != out_data[i])
			{
				Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i], expected_data[i]);
				status = false;
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}